

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_expr_t * gs_parse_expr_primary(gs_parser_t *parser)

{
  gs_token_t token_00;
  gs_token_t token_01;
  gs_token_t token_02;
  undefined1 auVar1 [24];
  _Bool _Var2;
  gs_expr_t *local_30;
  gs_expr_t *expr;
  gs_token_t token;
  gs_parser_t *parser_local;
  
  token.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)parser;
  gs_peek((gs_token_t *)&expr,parser);
  local_30 = (gs_expr_t *)0x0;
  if ((int)expr == 0) {
    auVar1._4_4_ = token.type;
    auVar1._8_4_ = token.line;
    auVar1._0_4_ = expr._4_4_;
    auVar1._12_8_ = token._8_8_;
    auVar1._20_4_ = 0;
    local_30 = gs_expr_int_new((gs_parser_t *)token.field_3.symbol,(gs_token_t)(auVar1 << 0x20));
    gs_eat((gs_parser_t *)token.field_3.symbol);
  }
  else if ((int)expr == 1) {
    token_00.line = expr._4_4_;
    token_00.type = 1;
    token_00.col = token.type;
    token_00._12_4_ = token.line;
    token_00.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)token._8_8_;
    local_30 = gs_expr_float_new((gs_parser_t *)token.field_3.symbol,token_00);
    gs_eat((gs_parser_t *)token.field_3.symbol);
  }
  else if ((int)expr == 2) {
    token_01.line = expr._4_4_;
    token_01.type = 2;
    token_01.col = token.type;
    token_01._12_4_ = token.line;
    token_01.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)token._8_8_;
    local_30 = gs_expr_symbol_new((gs_parser_t *)token.field_3.symbol,token_01);
    gs_eat((gs_parser_t *)token.field_3.symbol);
  }
  else if ((int)expr == 4) {
    token_02.line = expr._4_4_;
    token_02.type = 4;
    token_02.col = token.type;
    token_02._12_4_ = token.line;
    token_02.field_3 = (anon_union_8_5_f029217d_for_gs_token_3)token._8_8_;
    local_30 = gs_expr_string_new((gs_parser_t *)token.field_3.symbol,token_02);
    gs_eat((gs_parser_t *)token.field_3.symbol);
  }
  else {
    _Var2 = gs_eat_char((gs_parser_t *)token.field_3.symbol,'[');
    if (_Var2) {
      local_30 = gs_parse_expr_array_decl((gs_parser_t *)token.field_3.symbol);
    }
    else {
      _Var2 = gs_eat_char((gs_parser_t *)token.field_3.symbol,'(');
      if (_Var2) {
        _Var2 = gs_peek_val_type((gs_parser_t *)token.field_3.symbol,(gs_val_type *)0x0);
        if (_Var2) {
          local_30 = gs_parse_expr_cast((gs_parser_t *)token.field_3.symbol);
        }
        else {
          local_30 = gs_parse_expr((gs_parser_t *)token.field_3.symbol);
          if (((token.field_3.symbol[0x1c] & 1U) == 0) &&
             (_Var2 = gs_eat_char((gs_parser_t *)token.field_3.symbol,')'), !_Var2)) {
            gs_parser_error((gs_parser_t *)token.field_3.symbol,0x309acd);
          }
        }
      }
      else {
        gs_parser_error((gs_parser_t *)token.field_3.symbol,0x309aef);
      }
    }
  }
  return local_30;
}

Assistant:

static gs_expr_t *gs_parse_expr_primary(gs_parser_t *parser) {
    gs_token_t token = gs_peek(parser);
    gs_expr_t *expr = NULL;

    if (token.type == GS_TOKEN_INT) {
        expr = gs_expr_int_new(parser, token);
        gs_eat(parser);
    }
    else if (token.type == GS_TOKEN_FLOAT) {
        expr = gs_expr_float_new(parser, token);
        gs_eat(parser);
    }
    else if (token.type == GS_TOKEN_SYMBOL) {
        expr = gs_expr_symbol_new(parser, token);
        gs_eat(parser);
    }
    else if (token.type == GS_TOKEN_STRING) {
        expr = gs_expr_string_new(parser, token);
        gs_eat(parser);
    }
    else if (gs_eat_char(parser, '[')) {
        expr = gs_parse_expr_array_decl(parser);
    }
    else if (gs_eat_char(parser, '(')) {
        if (gs_peek_val_type(parser, NULL)) {
            expr = gs_parse_expr_cast(parser);
            if (parser->error) goto cleanup;
        }
        else {
            expr = gs_parse_expr(parser);
            if (parser->error) goto cleanup;

            if (!gs_eat_char(parser, ')')) {
                gs_parser_error(parser, token, "Expected ')' when parsing primary");
                goto cleanup;
            }
        }
    }
    else {
        gs_parser_error(parser, token, "Unknown token when parsing primary");
        goto cleanup;
    }

cleanup:
    return expr;
}